

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
__thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>
::
get_simplex_vertices<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
          (Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>
           *this,simplex_t idx,dimension_t dim,vertex_t n,
          reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *out)

{
  undefined1 idx_00 [16];
  uint uVar1;
  uint *puVar2;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
  *pRVar3;
  reference piVar4;
  undefined4 in_register_00000014;
  long extraout_RDX;
  undefined7 in_register_00000031;
  Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *this_00;
  char in_R8B;
  int in_R9D;
  bool bVar5;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  vertex_t vVar6;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffff40;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_70;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
  *local_68;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_60;
  char local_51;
  uint local_50;
  dimension_t k;
  vertex_t n_local;
  dimension_t dim_local;
  simplex_t idx_local;
  long local_30;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
  *this_local;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_20;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>
  *local_10;
  
  _n_local = (Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
              *)CONCAT44(in_register_00000014,n);
  local_50 = in_R9D - 1;
  idx_local._0_8_ = out;
  local_30 = CONCAT71(in_register_00000031,dim);
  this_local = _n_local;
  local_20 = out;
  local_10 = this;
  for (local_51 = in_R8B + '\x01'; '\x01' < local_51; local_51 = local_51 + -1) {
    this_00 = (Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *)
              (CONCAT71(in_register_00000031,dim) + 0x30);
    local_60 = (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                *)idx_local;
    local_68 = _n_local;
    idx_00._4_4_ = in_stack_ffffffffffffff3c;
    idx_00._0_4_ = in_stack_ffffffffffffff38;
    idx_00._8_8_ = in_stack_ffffffffffffff40;
    uVar1 = Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::get_max_vertex
                      (this_00,(simplex_t)idx_00,(dimension_t)_n_local,
                       (vertex_t)
                       (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                        *)idx_local);
    in_stack_ffffffffffffff40 = &local_70;
    local_50 = uVar1;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++(in_stack_ffffffffffffff40,(int)idx);
    puVar2 = (uint *)std::
                     reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                     ::operator*(in_stack_ffffffffffffff40);
    *puVar2 = uVar1;
    pRVar3 = (Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
              *)Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::operator()
                          ((simplex_t *)this_00,
                           (Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *
                           )(ulong)local_50,(int)local_51,(dimension_t)uVar1);
    bVar5 = _n_local < pRVar3;
    _n_local = (Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
                *)((long)_n_local - (long)pRVar3);
    idx_local._0_8_ =
         (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *)((long)(reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                    *)idx_local + (-(ulong)bVar5 - extraout_RDX));
  }
  vVar6 = n_local;
  piVar4 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
           ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                        *)idx);
  *piVar4 = vVar6;
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>::
  reverse_iterator((reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                    *)this,(reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                            *)idx);
  return (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          )(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this;
}

Assistant:

OutputIterator get_simplex_vertices(simplex_t idx, const dimension_t dim, vertex_t n,
        OutputIterator out) const {
      --n;
      for (dimension_t k = dim + 1; k > 1; --k) {
        n = simplex_encoding.get_max_vertex(idx, k, n);
        *out++ = n;
        idx -= simplex_encoding(n, k);
      }
      *out = static_cast<vertex_t>(idx);
      return out;
    }